

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tdm.cpp
# Opt level: O0

int __thiscall
CGameControllerTDM::OnCharacterDeath
          (CGameControllerTDM *this,CCharacter *pVictim,CPlayer *pKiller,int Weapon)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  IGameController *pIVar5;
  CPlayer *pCVar6;
  IServer *pIVar7;
  CConfig *pCVar8;
  int in_ECX;
  IGameController *in_RDX;
  CCharacter *in_RSI;
  IGameController *in_RDI;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  IGameController *this_00;
  
  IGameController::OnCharacterDeath
            (in_RDX,(CCharacter *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(CPlayer *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if ((in_RDX != (IGameController *)0x0) && (in_ECX != -3)) {
    this_00 = in_RDX;
    pIVar5 = (IGameController *)CCharacter::GetPlayer(in_RSI);
    if (in_RDX != pIVar5) {
      iVar1 = CPlayer::GetTeam((CPlayer *)this_00);
      pCVar6 = CCharacter::GetPlayer(in_RSI);
      iVar2 = CPlayer::GetTeam(pCVar6);
      if (iVar1 != iVar2) {
        uVar3 = CPlayer::GetTeam((CPlayer *)this_00);
        in_RDI->m_aTeamscore[(int)(uVar3 & 1)] = in_RDI->m_aTeamscore[(int)(uVar3 & 1)] + 1;
        goto LAB_0012e84e;
      }
    }
    uVar3 = CPlayer::GetTeam((CPlayer *)this_00);
    in_RDI->m_aTeamscore[(int)(uVar3 & 1)] = in_RDI->m_aTeamscore[(int)(uVar3 & 1)] + -1;
  }
LAB_0012e84e:
  pCVar6 = CCharacter::GetPlayer(in_RSI);
  iVar1 = pCVar6->m_RespawnTick;
  pIVar7 = IGameController::Server(in_RDI);
  iVar2 = IServer::Tick(pIVar7);
  pIVar7 = IGameController::Server(in_RDI);
  iVar4 = IServer::TickSpeed(pIVar7);
  pCVar8 = IGameController::Config(in_RDI);
  iVar1 = maximum<int>(iVar1,iVar2 + iVar4 * pCVar8->m_SvRespawnDelayTDM);
  pCVar6 = CCharacter::GetPlayer(in_RSI);
  pCVar6->m_RespawnTick = iVar1;
  return 0;
}

Assistant:

int CGameControllerTDM::OnCharacterDeath(class CCharacter *pVictim, class CPlayer *pKiller, int Weapon)
{
	IGameController::OnCharacterDeath(pVictim, pKiller, Weapon);


	if(pKiller && Weapon != WEAPON_GAME)
	{
		// do team scoring
		if(pKiller == pVictim->GetPlayer() || pKiller->GetTeam() == pVictim->GetPlayer()->GetTeam())
			m_aTeamscore[pKiller->GetTeam()&1]--; // klant arschel
		else
			m_aTeamscore[pKiller->GetTeam()&1]++; // good shit
	}

	pVictim->GetPlayer()->m_RespawnTick = maximum(pVictim->GetPlayer()->m_RespawnTick, Server()->Tick()+Server()->TickSpeed()*Config()->m_SvRespawnDelayTDM);

	return 0;
}